

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_colorspace_check_xy(png_XYZ *XYZ,png_xy *xy)

{
  int iVar1;
  undefined1 local_44 [8];
  png_xy xy_test;
  int result;
  png_xy *xy_local;
  png_XYZ *XYZ_local;
  
  unique0x1000005f = xy;
  xy_test.whitex = png_XYZ_from_xy(XYZ,xy);
  XYZ_local._4_4_ = xy_test.whitex;
  if ((xy_test.whitex == 0) &&
     (xy_test.whitex = png_xy_from_XYZ((png_xy *)local_44,XYZ), XYZ_local._4_4_ = xy_test.whitex,
     xy_test.whitex == 0)) {
    iVar1 = png_colorspace_endpoints_match(stack0xffffffffffffffe0,(png_xy *)local_44,5);
    if (iVar1 == 0) {
      XYZ_local._4_4_ = 1;
    }
    else {
      XYZ_local._4_4_ = 0;
    }
  }
  return XYZ_local._4_4_;
}

Assistant:

static int
png_colorspace_check_xy(png_XYZ *XYZ, const png_xy *xy)
{
   int result;
   png_xy xy_test;

   /* As a side-effect this routine also returns the XYZ endpoints. */
   result = png_XYZ_from_xy(XYZ, xy);
   if (result != 0)
      return result;

   result = png_xy_from_XYZ(&xy_test, XYZ);
   if (result != 0)
      return result;

   if (png_colorspace_endpoints_match(xy, &xy_test,
       5/*actually, the math is pretty accurate*/) != 0)
      return 0;

   /* Too much slip */
   return 1;
}